

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser * init_parse_curse(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"name str name",parse_curse_name);
  parser_reg(p_00,"type sym tval",parse_curse_type);
  parser_reg(p_00,"combat int to-h int to-d int to-a",parse_curse_combat);
  parser_reg(p_00,"effect sym eff ?sym type ?int radius ?int other",parse_curse_effect);
  parser_reg(p_00,"effect-yx int y int x",parse_curse_effect_yx);
  parser_reg(p_00,"dice str dice",parse_curse_dice);
  parser_reg(p_00,"expr sym name sym base str expr",parse_curse_expr);
  parser_reg(p_00,"msg str text",parse_curse_msg);
  parser_reg(p_00,"time rand time",parse_curse_time);
  parser_reg(p_00,"flags str flags",parse_curse_flags);
  parser_reg(p_00,"values str values",parse_curse_values);
  parser_reg(p_00,"desc str desc",parse_curse_desc);
  parser_reg(p_00,"conflict str conf",parse_curse_conflict);
  parser_reg(p_00,"conflict-flags str flags",parse_curse_conflict_flags);
  return p_00;
}

Assistant:

static struct parser *init_parse_curse(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_curse_name);
	parser_reg(p, "type sym tval", parse_curse_type);
	parser_reg(p, "combat int to-h int to-d int to-a", parse_curse_combat);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other", parse_curse_effect);
	parser_reg(p, "effect-yx int y int x", parse_curse_effect_yx);
	parser_reg(p, "dice str dice", parse_curse_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_curse_expr);
	parser_reg(p, "msg str text", parse_curse_msg);
	parser_reg(p, "time rand time", parse_curse_time);
	parser_reg(p, "flags str flags", parse_curse_flags);
	parser_reg(p, "values str values", parse_curse_values);
	parser_reg(p, "desc str desc", parse_curse_desc);
	parser_reg(p, "conflict str conf", parse_curse_conflict);
	parser_reg(p, "conflict-flags str flags", parse_curse_conflict_flags);
	return p;
}